

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  DUMB_IT_SIGDATA *pDVar5;
  IT_PATTERN *pIVar6;
  _func_int_void_ptr *p_Var7;
  byte *pbVar8;
  IT_PLAYING *pIVar9;
  uchar *puVar10;
  uchar uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  IT_ENTRY *pIVar16;
  void *pvVar17;
  IT_ENTRY *pIVar18;
  ulong uVar19;
  char cVar20;
  ushort uVar21;
  long lVar22;
  char *pcVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  byte bVar27;
  ulong uVar28;
  IT_CHANNEL *pIVar29;
  int i;
  long lVar30;
  float fVar31;
  double dVar32;
  double dVar33;
  
  pDVar5 = sigrenderer->sigdata;
  iVar14 = sigrenderer->speed;
  if (iVar14 == 0) {
LAB_005b16aa:
    if (((pDVar5->flags & 0x1000) != 0) && ((sigrenderer->tick & 0xf) != 0)) goto LAB_005b20c3;
  }
  else {
    piVar1 = &sigrenderer->tick;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_005b16aa;
    lVar30 = 0x35;
    do {
      pcVar23 = sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x52;
      pcVar23[0] = '\0';
      pcVar23[1] = '\0';
      sigrenderer->channel[0].arpeggio_offsets[lVar30 + -0x50] = '\0';
      lVar30 = lVar30 + 0xa0;
    } while (lVar30 != 0x2835);
    sigrenderer->tick = iVar14;
    piVar1 = &sigrenderer->rowcount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      pIVar18 = sigrenderer->entry_end;
      for (pIVar16 = sigrenderer->entry; (pIVar16 < pIVar18 && (pIVar16->channel < 0x40));
          pIVar16 = pIVar16 + 1) {
        if (((pIVar16->mask & 8) != 0) && (pIVar16->effect != '\x0f')) {
          process_effects(sigrenderer,pIVar16,0);
          pIVar18 = sigrenderer->entry_end;
        }
      }
LAB_005b20bb:
      update_effects(sigrenderer);
      goto LAB_005b20c3;
    }
    sigrenderer->rowcount = 1;
    if (sigrenderer->n_rows == 0) {
      iVar14 = 0;
    }
    else {
      bit_array_set(sigrenderer->played,(long)sigrenderer->row + (long)sigrenderer->order * 0x100);
      lVar30 = 0xb8;
      do {
        pvVar17 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x58);
        if (pvVar17 != (void *)0x0) {
          if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50) ==
              sigrenderer->order) {
            bit_array_set(pvVar17,(long)sigrenderer->row);
          }
          else {
            bit_array_destroy(pvVar17);
            *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x58) = 0;
            *(undefined4 *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50) = 0xfffe;
          }
        }
        lVar30 = lVar30 + 0xa0;
      } while (lVar30 != 0x28b8);
      iVar14 = sigrenderer->n_rows;
    }
    uVar12 = sigrenderer->processrow + 1;
    sigrenderer->processrow = uVar12;
    if ((int)uVar12 < iVar14) {
      pIVar16 = sigrenderer->entry;
      if (pIVar16 == (IT_ENTRY *)0x0) {
        bit_array_clear(sigrenderer->played,(long)sigrenderer->order << 8);
        sigrenderer->entry = sigrenderer->entry_start;
        sigrenderer->row = 0;
      }
      else {
        if (pIVar16 < sigrenderer->entry_end) {
          do {
            puVar10 = &pIVar16->channel;
            pIVar16 = pIVar16 + 1;
            if (0x3f < *puVar10) break;
          } while (pIVar16 < sigrenderer->entry_end);
          sigrenderer->entry = pIVar16;
        }
        sigrenderer->row = sigrenderer->row + 1;
      }
LAB_005b1b7c:
      if ((pDVar5->flags & 0x400) == 0) {
        sigrenderer->globalvolslide = '\0';
        sigrenderer->temposlide = '\0';
        lVar30 = 0x20;
        do {
          reset_channel_effects
                    ((IT_CHANNEL *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50));
          lVar30 = lVar30 + 0xa0;
        } while (lVar30 != 0x2820);
      }
      pIVar16 = sigrenderer->entry;
      pIVar18 = sigrenderer->entry_end;
      uVar12 = 0;
      if (pIVar16 < pIVar18) {
        bVar27 = pIVar16->channel;
        uVar12 = 0;
        if (bVar27 < 0x40) {
          uVar12 = 0;
          do {
            uVar25 = 0;
            if ((pIVar16->mask & 8) != 0) {
              if (pIVar16->effect == '\x13') {
                uVar19 = (ulong)((uint)bVar27 * 0xa0);
                bVar27 = pIVar16->effectvalue;
                uVar28 = (ulong)bVar27;
                uVar13 = sigrenderer->sigdata->flags;
                if ((uVar13 >> 8 & 1) == 0) {
                  if (bVar27 == 0) {
                    uVar28 = (ulong)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x41];
                  }
                }
                else {
                  if (bVar27 == 0) {
                    uVar28 = (ulong)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x31];
                  }
                  sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x31] = (char)uVar28;
                }
                sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x41] = (byte)uVar28;
                iVar14 = (int)(uVar28 >> 4);
                if (iVar14 == 0xe) {
                  sigrenderer->rowcount = ((uint)uVar28 & 0xf) + 1;
                  goto LAB_005b1d30;
                }
                uVar25 = 0;
                if (iVar14 != 0xb) goto LAB_005b1d32;
                if ((uVar28 & 0xf) == 0) {
                  pvVar17 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x60);
                  if (pvVar17 == (void *)0x0) {
                    pvVar17 = bit_array_create(0x100);
                    *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x60) = pvVar17;
                  }
                  else {
                    iVar14 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68);
                    if (((long)iVar14 != 0xfffe) && (iVar14 != sigrenderer->order)) {
                      bit_array_merge(sigrenderer->played,pvVar17,(long)iVar14 << 8);
                      pvVar17 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x60)
                      ;
                    }
                    bit_array_reset(pvVar17);
                  }
                  *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68) =
                       sigrenderer->order;
                  sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42] =
                       (char)sigrenderer->processrow;
LAB_005b1fc6:
                  uVar25 = 0;
                }
                else {
                  cVar20 = sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x43];
                  if (cVar20 == '\0') {
                    iVar14 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68);
                    if (iVar14 == 0xfffe) {
                      bit_array_destroy(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                                  uVar19 + 0x60));
                      pvVar17 = bit_array_create(0x100);
                      *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x60) = pvVar17
                      ;
                      bVar27 = sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42];
                      uVar26 = (ulong)bVar27;
                      if ((int)(uint)bVar27 <= sigrenderer->row) {
                        do {
                          bit_array_clear(sigrenderer->played,
                                          (long)sigrenderer->order * 0x100 + uVar26);
                          iVar14 = (int)uVar26;
                          uVar26 = uVar26 + 1;
                        } while (iVar14 < sigrenderer->row);
                      }
                      *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68) =
                           sigrenderer->order;
                    }
                    else if (iVar14 == sigrenderer->order) {
                      bit_array_set(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                              uVar19 + 0x60),(long)sigrenderer->row);
                      bit_array_mask(sigrenderer->played,
                                     *(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                               uVar19 + 0x60),
                                     (long)*(int *)(sigrenderer->channel[0].arpeggio_offsets +
                                                   uVar19 + 0x68) << 8);
                    }
                    sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x43] = (byte)uVar28 & 0xf;
                    sigrenderer->breakrow =
                         (uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42];
                    uVar13 = sigrenderer->sigdata->flags;
                  }
                  else {
                    cVar20 = cVar20 + -1;
                    sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x43] = cVar20;
                    if (cVar20 == '\0') {
                      if ((uVar13 & 0xc0) == 0x40) {
                        sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x44] = '\0';
                        if ((int)(sigrenderer->processrow | 0xc00U) < 0xfffe) {
                          sigrenderer->breakrow =
                               (uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42];
                        }
                      }
                      else {
                        sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42] =
                             (char)sigrenderer->processrow + '\x01';
                      }
                      iVar14 = sigrenderer->order;
                      if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68) ==
                          iVar14) {
                        bit_array_destroy(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                                    uVar19 + 0x60));
                        *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x60) =
                             0;
                        *(undefined4 *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68) =
                             0xfffe;
                        iVar14 = sigrenderer->order;
                      }
                      bit_array_clear(sigrenderer->played,
                                      (long)sigrenderer->row + (long)iVar14 * 0x100);
                      goto LAB_005b1fc6;
                    }
                    if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar19 + 0x68) ==
                        sigrenderer->order) {
                      bit_array_set(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                              uVar19 + 0x60),(long)sigrenderer->row);
                      bit_array_mask(sigrenderer->played,
                                     *(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                               uVar19 + 0x60),
                                     (long)*(int *)(sigrenderer->channel[0].arpeggio_offsets +
                                                   uVar19 + 0x68) << 8);
                      uVar13 = sigrenderer->sigdata->flags;
                    }
                    sigrenderer->breakrow =
                         (uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x42];
                  }
                  if ((uVar13 & 0xc0) == 0x40) {
                    uVar13 = sigrenderer->processrow;
                    uVar25 = 1;
                    if ((int)(uVar13 | 0xc00) < 0xfffe) {
                      sigrenderer->processorder =
                           (int)uVar13 <
                           (int)(uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x44]
                           ^ 0xffff;
                      sigrenderer->channel[0].arpeggio_offsets[uVar19 + 0x44] = (char)uVar13;
                      sigrenderer->processrow = 0xffff;
                    }
                  }
                  else {
                    sigrenderer->processorder = 0xffff;
                    sigrenderer->processrow = 0xfffe;
                    uVar25 = 1;
                  }
                }
              }
              else if (pIVar16->effect == '\x02') {
                iVar14 = 0xf3fe;
                if ((sigrenderer->processrow & 0xfffffbffU) != 0xf3fe) {
                  sigrenderer->breakrow = 0;
                  iVar14 = 0xfbfe;
                }
                sigrenderer->processrow = iVar14;
                sigrenderer->processorder = pIVar16->effectvalue - 1;
LAB_005b1d30:
                uVar25 = 0;
              }
            }
LAB_005b1d32:
            uVar12 = uVar12 | uVar25;
            pIVar16 = pIVar16 + 1;
            pIVar18 = sigrenderer->entry_end;
          } while ((pIVar16 < pIVar18) && (bVar27 = pIVar16->channel, bVar27 < 0x40));
        }
        pIVar16 = sigrenderer->entry;
      }
      if (pIVar16 < pIVar18) {
        do {
          if (0x3f < pIVar16->channel) break;
          uVar25 = 0;
          if ((pDVar5->flags & 0x40) == 0) {
            uVar25 = uVar12;
          }
          pIVar29 = (IT_CHANNEL *)
                    (sigrenderer->channel[0].arpeggio_offsets +
                    ((ulong)((uint)pIVar16->channel * 0xa0) - 0x30));
          bVar27 = pIVar16->mask;
          if ((bVar27 & 1) != 0) {
            pIVar29->note = pIVar16->note;
          }
          if (((bVar27 & 9) != 0) && ((sigrenderer->sigdata->flags & 0x400) != 0)) {
            reset_channel_effects(pIVar29);
            if (pIVar29->playing != (IT_PLAYING *)0x0) {
              pIVar29->playing->finetune = 0;
            }
          }
          if ((((pIVar16->mask & 8) == 0) || (pIVar16->effect != '\x13')) ||
             ((pIVar29->lastS & 0xf0) != 0xd0)) {
            iVar14 = process_note_data(sigrenderer,pIVar16,uVar25);
            if (iVar14 != 0) {
              return 1;
            }
          }
          else {
            bVar27 = pIVar29->lastS & 0xf;
            if (bVar27 < 2) {
              bVar27 = 1;
            }
            pIVar29->note_delay_count = bVar27;
            pIVar29->note_delay_entry = pIVar16;
          }
          pIVar16 = pIVar16 + 1;
        } while (pIVar16 < sigrenderer->entry_end);
      }
      if (((uint)pDVar5->flags >> 0xb & 1) == 0) {
        if ((pDVar5->flags & 0x10U) == 0) {
          update_smooth_effects(sigrenderer);
        }
        goto LAB_005b20c3;
      }
      goto LAB_005b20bb;
    }
    iVar14 = sigrenderer->processorder;
    sigrenderer->processrow = sigrenderer->breakrow;
    sigrenderer->breakrow = 0;
    if ((uVar12 & 0xfffff3ff) == 0xf3ff) {
      lVar30 = 0x94;
      do {
        sigrenderer->channel[0].arpeggio_offsets[lVar30 + -0x50] = '\0';
        lVar30 = lVar30 + 0xa0;
      } while (lVar30 != 0x2894);
    }
    iVar15 = iVar14;
    if (iVar14 == 0xffff) {
      iVar15 = sigrenderer->order + -1;
    }
LAB_005b1a01:
    while( true ) {
      iVar15 = iVar15 + 1;
      sigrenderer->processorder = iVar15;
      iVar24 = pDVar5->n_orders;
      if (iVar15 < iVar24) break;
      iVar15 = sigrenderer->restart_position;
      sigrenderer->processorder = iVar15;
      if (iVar15 < iVar24) {
        if ((pDVar5->flags & 0x800) != 0) {
          sigrenderer->speed = pDVar5->speed;
          sigrenderer->tempo = pDVar5->tempo;
          lVar30 = 0x20;
          do {
            xm_note_off(pDVar5,(IT_CHANNEL *)
                               (sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50));
            lVar30 = lVar30 + 0xa0;
          } while (lVar30 != 0x2820);
          iVar15 = sigrenderer->processorder;
        }
        break;
      }
      sigrenderer->processorder = -1;
      iVar15 = -1;
    }
    bVar27 = pDVar5->order[iVar15];
    if (pDVar5->n_patterns <= (int)(uint)bVar27) {
      if (bVar27 != 0xfe) {
        sigrenderer->processorder = sigrenderer->restart_position + -1;
      }
      lVar30 = 0;
      do {
        bit_array_set(sigrenderer->played,(long)sigrenderer->processorder * 0x100 + lVar30);
        lVar30 = lVar30 + 1;
      } while ((int)lVar30 != 0x100);
      iVar15 = sigrenderer->processorder;
      goto LAB_005b1a01;
    }
    pIVar6 = pDVar5->pattern;
    iVar24 = sigrenderer->processrow;
    iVar4 = sigrenderer->n_rows;
    iVar3 = pIVar6[bVar27].n_rows;
    sigrenderer->n_rows = iVar3;
    if (iVar3 <= iVar24) {
      sigrenderer->processrow = 0;
      iVar24 = 0;
    }
    pIVar16 = pIVar6[bVar27].entry;
    sigrenderer->entry_start = pIVar16;
    sigrenderer->entry = pIVar16;
    sigrenderer->entry_end = pIVar16 + pIVar6[bVar27].n_entries;
    if (iVar4 == 0) {
LAB_005b1b32:
      iVar14 = sigrenderer->processrow;
      sigrenderer->order = sigrenderer->processorder;
      if (iVar14 != 0) {
        pIVar16 = sigrenderer->entry;
        iVar15 = iVar14;
        do {
          if (pIVar16 < sigrenderer->entry_end) {
            do {
              puVar10 = &pIVar16->channel;
              pIVar16 = pIVar16 + 1;
              if (0x3f < *puVar10) break;
            } while (pIVar16 < sigrenderer->entry_end);
            sigrenderer->entry = pIVar16;
          }
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      sigrenderer->row = iVar14;
      goto LAB_005b1b7c;
    }
    if (iVar14 == 0xffff) {
      if (iVar15 < sigrenderer->order) goto LAB_005b1adf;
      goto LAB_005b1b32;
    }
    if (sigrenderer->order < iVar15) goto LAB_005b1b32;
LAB_005b1adf:
    iVar14 = bit_array_test(sigrenderer->played,(long)(iVar24 + iVar15 * 0x100));
    if (iVar14 == 0) goto LAB_005b1b32;
    p_Var7 = sigrenderer->callbacks->loop;
    if (p_Var7 == (_func_int_void_ptr *)0x0) goto LAB_005b1b32;
    iVar14 = (*p_Var7)(sigrenderer->callbacks->loop_data);
    if (iVar14 != 0) {
      return 1;
    }
    bit_array_reset(sigrenderer->played);
    if (sigrenderer->speed != 0) goto LAB_005b1b32;
  }
  update_effects(sigrenderer);
  lVar30 = 0;
  do {
    pIVar29 = sigrenderer->channel + lVar30;
    uVar11 = sigrenderer->channel[lVar30].key_off_count;
    if (uVar11 == '\0') {
      if (pIVar29->note_cut_count == '\0') {
        if ((pIVar29->note_delay_count != '\0') &&
           (uVar11 = pIVar29->note_delay_count + 0xff, pIVar29->note_delay_count = uVar11,
           uVar11 == '\0')) {
          process_note_data(sigrenderer,pIVar29->note_delay_entry,0);
        }
      }
      else {
        uVar11 = pIVar29->note_cut_count + 0xff;
        pIVar29->note_cut_count = uVar11;
        if (uVar11 == '\0') {
          if ((sigrenderer->sigdata->flags & 0x240) == 0) {
            pIVar9 = pIVar29->playing;
            if (pIVar9 != (IT_PLAYING *)0x0) {
              lVar22 = 0;
              do {
                if (sigrenderer->playing[lVar22] == (IT_PLAYING *)0x0) {
                  pIVar9->declick_stage = '\x03';
                  sigrenderer->playing[lVar22] = pIVar9;
                  goto LAB_005b1786;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0xc0);
              pIVar9->next = sigrenderer->free_playing;
              sigrenderer->free_playing = pIVar9;
LAB_005b1786:
              pIVar29->playing = (IT_PLAYING *)0x0;
            }
          }
          else {
            pIVar29->volume = '\0';
          }
        }
      }
    }
    else {
      uVar11 = uVar11 + 0xff;
      pIVar29->key_off_count = uVar11;
      if (uVar11 == '\0') {
        xm_note_off(sigrenderer->sigdata,pIVar29);
      }
    }
    lVar30 = lVar30 + 1;
  } while (lVar30 != 0x40);
LAB_005b20c3:
  p_Var7 = sigrenderer->callbacks->global_volume_zero;
  if (sigrenderer->globalvolume == '\0') {
    if (p_Var7 != (_func_int_void_ptr *)0x0) {
      iVar14 = ((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) * 0x10000 +
                sigrenderer->gvz_sub_time >> 0x10) + sigrenderer->gvz_time;
      sigrenderer->gvz_time = iVar14;
      sigrenderer->gvz_sub_time = sigrenderer->gvz_sub_time & 0xffff;
      if ((0xbffff < iVar14) &&
         (iVar14 = (*p_Var7)(sigrenderer->callbacks->global_volume_zero_data), iVar14 != 0)) {
        return 1;
      }
    }
  }
  else if (p_Var7 != (_func_int_void_ptr *)0x0) {
    sigrenderer->gvz_time = 0;
    sigrenderer->gvz_sub_time = 0;
  }
  pDVar5 = sigrenderer->sigdata;
  iVar14 = sigrenderer->tempo;
  lVar30 = 0;
  do {
    pbVar8 = *(byte **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + 0x58);
    if (pbVar8 == (byte *)0x0) goto LAB_005b24b4;
    switch(pbVar8[0x55]) {
    case 1:
      uVar19 = (ulong)pbVar8[0x54];
      pcVar23 = 
      "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
      ;
      break;
    case 2:
      uVar19 = (ulong)pbVar8[0x54];
      pcVar23 = 
      "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
      ;
      break;
    case 3:
      iVar15 = rand();
      iVar15 = iVar15 % 0x81 + -0x40;
      goto LAB_005b21f5;
    case 4:
      uVar19 = (ulong)pbVar8[0x54];
      pcVar23 = it_xm_squarewave;
      break;
    case 5:
      uVar19 = (ulong)pbVar8[0x54];
      goto LAB_005b21dc;
    case 6:
      uVar19 = (ulong)pbVar8[0x54] ^ 0xff;
LAB_005b21dc:
      pcVar23 = "";
      break;
    default:
      uVar19 = (ulong)pbVar8[0x54];
      pcVar23 = "";
    }
    iVar15 = (int)pcVar23[uVar19];
LAB_005b21f5:
    iVar24 = (int)((uint)pbVar8[0x52] * (uint)pbVar8[0x53] * iVar15) >> 4;
    uVar12 = pDVar5->flags;
    iVar15 = -iVar24;
    if ((uVar12 & 0x10) == 0) {
      iVar15 = iVar24;
    }
    bVar27 = sigrenderer->channel[0].arpeggio_offsets[lVar30 + -0x2c];
    pbVar8[0x45] = bVar27;
    uVar21 = *(ushort *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x26);
    *(ushort *)(pbVar8 + 0x46) = uVar21;
    bVar2 = pbVar8[0x48];
    if ((bVar2 != 0) &&
       (bVar27 = (char)((uint)bVar27 * (int)(char)bVar2 >> 7) + bVar27, pbVar8[0x45] = bVar27,
       0x40 < bVar27)) {
      pbVar8[0x45] = (byte)~bVar2 >> 1 & 0x40;
    }
    bVar27 = pbVar8[0x49];
    if (((bVar27 != 0) && (uVar21 < 0x4001)) &&
       (uVar21 = uVar21 + (ushort)bVar27 * 0x100, *(ushort *)(pbVar8 + 0x46) = uVar21,
       0x4000 < uVar21)) {
      *(ushort *)(pbVar8 + 0x46) = (ushort)(-1 < (char)bVar27) << 0xe;
    }
    if ((uVar12 & 8) == 0) {
      iVar4 = *(int *)(pbVar8 + 0x68);
      dVar32 = exp2((double)(int)(0x3c00 - ((uint)pbVar8[0x4a] * 0x100 + *(int *)(pbVar8 + 0x70))) *
                    0.0003255208333333158);
      iVar24 = *(int *)(*(long *)(pbVar8 + 0x10) + 0x44);
      fVar31 = (float)(iVar15 + iVar4) * -1.7621046e-08 + (float)dVar32 / (float)iVar24;
      if (4.656613e-10 <= fVar31) {
        fVar31 = 1.5258789e-05 / fVar31;
        goto LAB_005b2370;
      }
      *pbVar8 = *pbVar8 | 8;
      pbVar8[0x6c] = 0;
      pbVar8[0x6d] = 0;
      pbVar8[0x6e] = 0;
      pbVar8[0x6f] = 0x38;
    }
    else {
      iVar15 = (uint)pbVar8[0x4a] * 0x100 +
               iVar15 + *(int *)(pbVar8 + 0x70) + *(int *)(pbVar8 + 0x68) + -0x3c00;
      dVar32 = -10.666666666666092;
      if (-0x8001 < iVar15) {
        if (0x7ffe < iVar15) {
          iVar15 = 0x7fff;
        }
        dVar32 = (double)iVar15 * 0.0003255208333333158;
      }
      dVar32 = exp2(dVar32);
      iVar24 = *(int *)(*(long *)(pbVar8 + 0x10) + 0x44);
      fVar31 = (float)dVar32 * 1.5258789e-05 * (float)iVar24;
LAB_005b2370:
      *(float *)(pbVar8 + 0x6c) = fVar31;
      lVar22 = *(long *)(pbVar8 + 8);
      if (((*(char *)(lVar22 + 0x5b) != '\0') && (*(int *)(lVar22 + 0x4c) != 0)) &&
         (*(byte *)(lVar22 + 0x59) < 0x78)) {
        dVar32 = log((double)((fVar31 * 65536.0) / (float)iVar24));
        dVar33 = dVar32 * 17.31234049066756 + 60.5;
        dVar32 = 119.0;
        if ((dVar33 <= 119.0) && (dVar32 = dVar33, dVar33 < 0.0)) {
          dVar32 = 0.0;
        }
        dVar32 = exp2((double)((int)dVar32 + -0x3c) * 0.0833333333333334);
        fVar31 = (float)iVar24 * 1.5258789e-05 * (float)dVar32;
        *(float *)(pbVar8 + 0x6c) = fVar31;
      }
      uVar12 = sigrenderer->tick;
      uVar25 = sigrenderer->speed - uVar12;
      if (uVar25 == 0) {
        uVar12 = 0;
      }
      if ((sigrenderer->sigdata->flags & 0xc0U) != 0x40) {
        uVar12 = uVar25;
      }
      dVar32 = exp2((double)(int)sigrenderer->channel[0].arpeggio_offsets
                                 [(ulong)*(byte *)(*(long *)(sigrenderer->channel[0].
                                                             arpeggio_offsets + lVar30 + -8) +
                                                  (ulong)(uVar12 & 0x1f)) + lVar30] *
                    0.0833333333333334);
      *(float *)(pbVar8 + 0x6c) = (float)dVar32 * fVar31;
      pbVar8[0x4c] = sigrenderer->channel[0].arpeggio_offsets[lVar30 + -0x1f];
      pbVar8[0x4d] = sigrenderer->channel[0].arpeggio_offsets[lVar30 + -0x1e];
    }
LAB_005b24b4:
    lVar30 = lVar30 + 0xa0;
    if (lVar30 == 0x2800) {
      fVar31 = (float)iVar14 * 6.1035157e-06;
      lVar30 = 0xa8;
      do {
        pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50);
        if (((pIVar9 != (IT_PLAYING *)0x0) &&
            (process_playing(sigrenderer,pIVar9,fVar31), (pDVar5->flags & 0x40) == 0)) &&
           (pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50),
           (pIVar9->flags & 8) != 0)) {
          pIVar9->next = sigrenderer->free_playing;
          sigrenderer->free_playing = pIVar9;
          *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 + -0x50) = 0;
        }
        lVar30 = lVar30 + 0xa0;
      } while (lVar30 != 0x28a8);
      lVar30 = 0x504;
      do {
        pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 * 8 + -0x50);
        if (pIVar9 != (IT_PLAYING *)0x0) {
          process_playing(sigrenderer,pIVar9,fVar31);
          pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar30 * 8 + -0x50);
          if ((pIVar9->flags & 8) != 0) {
            pIVar9->next = sigrenderer->free_playing;
            sigrenderer->free_playing = pIVar9;
            *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar30 * 8 + -0x50) = 0;
          }
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0x5c4);
      lVar30 = (long)sigrenderer->sub_time_left +
               ((long)((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) << 0x10) >>
               ((byte)((uint)sigrenderer->sigdata->flags >> 10) & 4));
      sigrenderer->time_left = sigrenderer->time_left + (int)((ulong)lVar30 >> 0x10);
      sigrenderer->sub_time_left = (uint)lVar30 & 0xffff;
      return 0;
    }
  } while( true );
}

Assistant:

static int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)
{
	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;

	// Set note vol/freq to vol/freq set for each channel

	if (sigrenderer->speed && --sigrenderer->tick == 0) {
		reset_tick_counts(sigrenderer);
		sigrenderer->tick = sigrenderer->speed;
		sigrenderer->rowcount--;
		if (sigrenderer->rowcount == 0) {
			sigrenderer->rowcount = 1;

#ifdef BIT_ARRAY_BULLSHIT
			if (sigrenderer->n_rows)
			{
#if 1
				/*
				if (bit_array_test(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row))
				{
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
						bit_array_reset(sigrenderer->played);
						if (sigrenderer->speed == 0)
							goto speed0; // I love goto
					}
				}
				*/
#endif
				bit_array_set(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row);
				{
					int n;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++)
					{
						IT_CHANNEL * channel = &sigrenderer->channel[n];
						if (channel->played_patjump)
						{
							if (channel->played_patjump_order == sigrenderer->order)
							{
								bit_array_set(channel->played_patjump, sigrenderer->row);
							}
							/*
							else if ((channel->played_patjump_order & 0x7FFF) == sigrenderer->order)
							{
								channel->played_patjump_order |= 0x4000;
							}
							else if ((channel->played_patjump_order & 0x3FFF) == sigrenderer->order)
							{
								if ((sigdata->flags & (IT_WAS_AN_XM|IT_WAS_A_MOD)) == IT_WAS_AN_XM)
								{
									// joy, was XM, pattern loop bug triggered break to row in same order 
									bit_array_mask(sigrenderer->played, channel->played_patjump, sigrenderer->order * 256);
								}
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
							*/
							else
							{
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
						}
					}
				}
			}
#endif

			sigrenderer->processrow++;

			if (sigrenderer->processrow >= sigrenderer->n_rows) {
				IT_PATTERN *pattern;
				int n;
				int processorder = sigrenderer->processorder;

				if ((sigrenderer->processrow|0xC00) == 0xFFFE + 1) { /* It was incremented above! */
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++) sigrenderer->channel[n].pat_loop_end_row = 0;
				} else {
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0; // XXX lolwut
				}

				if (sigrenderer->processorder == 0xFFFF)
					sigrenderer->processorder = sigrenderer->order - 1;

				for (;;) {
					sigrenderer->processorder++;

					if (sigrenderer->processorder >= sigdata->n_orders) {
						sigrenderer->processorder = sigrenderer->restart_position;
						if (sigrenderer->processorder >= sigdata->n_orders) {
							/* Restarting beyond end. We'll loop for now. */
							sigrenderer->processorder = -1;
							continue;
						}
						if (sigdata->flags & IT_WAS_AN_OKT) {
							/* Reset some things */
							sigrenderer->speed = sigdata->speed;
							sigrenderer->tempo = sigdata->tempo;
							for (n = 0; n < DUMB_IT_N_CHANNELS; n++) {
								xm_note_off(sigdata, &sigrenderer->channel[n]);
							}
						}
					}

					n = sigdata->order[sigrenderer->processorder];

					if (n < sigdata->n_patterns)
						break;

#ifdef INVALID_ORDERS_END_SONG
					if (n != IT_ORDER_SKIP)
#else
					if (n == IT_ORDER_END)
#endif
					{
						sigrenderer->processorder = sigrenderer->restart_position - 1;
					}

#ifdef BIT_ARRAY_BULLSHIT
					/* Fix play tracking and timekeeping for orders containing skip commands */
					for (n = 0; n < 256; n++) {
						bit_array_set(sigrenderer->played, sigrenderer->processorder * 256 + n);
					}
#endif
				}

				pattern = &sigdata->pattern[n];

				n = sigrenderer->n_rows;
				sigrenderer->n_rows = pattern->n_rows;

				if (sigrenderer->processrow >= sigrenderer->n_rows)
					sigrenderer->processrow = 0;

/** WARNING - everything pertaining to a new pattern initialised? */

				sigrenderer->entry = sigrenderer->entry_start = pattern->entry;
				sigrenderer->entry_end = sigrenderer->entry + pattern->n_entries;

				/* If n_rows was 0, we're only just starting. Don't do anything weird here. */
				/* added: process row check, for break to row spooniness */
				if (n && (processorder == 0xFFFF ? sigrenderer->order > sigrenderer->processorder : sigrenderer->order >= sigrenderer->processorder)
#ifdef BIT_ARRAY_BULLSHIT
					&& bit_array_test(sigrenderer->played, sigrenderer->processorder * 256 + sigrenderer->processrow)
#endif
					) {
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
#ifdef BIT_ARRAY_BULLSHIT
						bit_array_reset(sigrenderer->played);
#endif
						if (sigrenderer->speed == 0)
							goto speed0; /* I love goto */
					}
				}
				sigrenderer->order = sigrenderer->processorder;

				n = sigrenderer->processrow;
				while (n) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					n--;
				}
				sigrenderer->row = sigrenderer->processrow;
			} else {
				if (sigrenderer->entry) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					sigrenderer->row++;
				} else {
#ifdef BIT_ARRAY_BULLSHIT
					bit_array_clear(sigrenderer->played, sigrenderer->order * 256);
#endif
					sigrenderer->entry = sigrenderer->entry_start;
					sigrenderer->row = 0;
				}
			}

			if (!(sigdata->flags & IT_WAS_A_669))
				reset_effects(sigrenderer);

			{
				IT_ENTRY *entry = sigrenderer->entry;
				int ignore_cxx = 0;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					ignore_cxx |= update_pattern_variables(sigrenderer, entry++);

				entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					if (process_entry(sigrenderer, entry++, sigdata->flags & IT_WAS_AN_XM ? 0 : ignore_cxx))
						return 1;
			}

			if (sigdata->flags & IT_WAS_AN_OKT)
				update_effects(sigrenderer);
			else if (!(sigdata->flags & IT_OLD_EFFECTS))
				update_smooth_effects(sigrenderer);
		} else {
			{
				IT_ENTRY *entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry)) {
					if (entry->mask & IT_ENTRY_EFFECT && entry->effect != IT_SET_SAMPLE_OFFSET)
						process_effects(sigrenderer, entry, 0);
							/* Don't bother checking the return value; if there
							 * was a pattern delay, there can't be a speed=0.
							 */
					entry++;
				}
			}

			update_effects(sigrenderer);
		}
	} else {
		if ( !(sigdata->flags & IT_WAS_AN_STM) || !(sigrenderer->tick & 15)) {
			speed0:
			update_effects(sigrenderer);
			update_tick_counts(sigrenderer);
		}
	}

	if (sigrenderer->globalvolume == 0) {
		if (sigrenderer->callbacks->global_volume_zero) {
			LONG_LONG t = sigrenderer->gvz_sub_time + ((TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16);
			sigrenderer->gvz_time += (int)(t >> 16);
			sigrenderer->gvz_sub_time = (int)t & 65535;
			if (sigrenderer->gvz_time >= 65536 * 12) {
				if ((*sigrenderer->callbacks->global_volume_zero)(sigrenderer->callbacks->global_volume_zero_data))
					return 1;
			}
		}
	} else {
		if (sigrenderer->callbacks->global_volume_zero) {
			sigrenderer->gvz_time = 0;
			sigrenderer->gvz_sub_time = 0;
		}
	}

	process_all_playing(sigrenderer);

	{
		LONG_LONG t = (TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16;
		if ( sigrenderer->sigdata->flags & IT_WAS_AN_STM ) {
			t /= 16;
		}
		t += sigrenderer->sub_time_left;
		sigrenderer->time_left += (int)(t >> 16);
		sigrenderer->sub_time_left = (int)t & 65535;
	}

	return 0;
}